

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutApi.c
# Opt level: O1

void Cut_NodeSetTriv(Cut_Man_t *p,int Node)

{
  Cut_Cut_t *pCVar1;
  
  pCVar1 = Cut_NodeReadCutsNew(p,Node);
  if (pCVar1 != (Cut_Cut_t *)0x0) {
    __assert_fail("Cut_NodeReadCutsNew(p, Node) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutApi.c"
                  ,0x93,"void Cut_NodeSetTriv(Cut_Man_t *, int)");
  }
  pCVar1 = Cut_CutCreateTriv(p,Node);
  if ((-1 < Node) && (Node < p->vCutsNew->nSize)) {
    p->vCutsNew->pArray[(uint)Node] = pCVar1;
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
}

Assistant:

void Cut_NodeSetTriv( Cut_Man_t * p, int Node )
{
    assert( Cut_NodeReadCutsNew(p, Node) == NULL );
    Cut_NodeWriteCutsNew( p, Node, Cut_CutCreateTriv(p, Node) );
}